

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argtable3.c
# Opt level: O3

int arg_make_syntax_err_help_msg
              (arg_dstr_t ds,char *name,int help,int nerrors,void **argtable,arg_end *end,
              int *exitcode)

{
  int iVar1;
  
  if (help < 1) {
    if (nerrors < 1) {
      return 0;
    }
    arg_make_syntax_err_msg(ds,argtable,end);
    iVar1 = 1;
  }
  else {
    arg_make_help_msg(ds,name,argtable);
    iVar1 = 0;
  }
  *exitcode = iVar1;
  return 1;
}

Assistant:

int arg_make_syntax_err_help_msg(arg_dstr_t ds, char* name, int help, int nerrors, void** argtable, struct arg_end* end, int* exitcode) {
    /* help handling
     * note: '-h|--help' takes precedence over error reporting
     */
    if (help > 0) {
        arg_make_help_msg(ds, name, argtable);
        *exitcode = EXIT_SUCCESS;
        return 1;
    }

    /* syntax error handling */
    if (nerrors > 0) {
        arg_make_syntax_err_msg(ds, argtable, end);
        *exitcode = EXIT_FAILURE;
        return 1;
    }

    return 0;
}